

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

uint8_t * decode_tiles_row_mt(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,int start_tile,
                             int end_tile)

{
  int iVar1;
  int iVar2;
  AV1_COMMON *cm_00;
  int *piVar3;
  void *pvVar4;
  int in_ECX;
  uint8_t *in_RSI;
  long in_RDI;
  int in_R8D;
  TileDataDec *tile_data;
  TileDataDec *tile_data_3;
  int i_1;
  TileDataDec *tile_data_2;
  int col;
  int row;
  TileDataDec *tile_data_1;
  int i;
  int max_sb_rows;
  uint8_t *raw_data_end;
  int max_threads;
  int num_workers;
  int tile_count_tg;
  int tile_cols_end;
  int tile_cols_start;
  int tile_rows_end;
  int tile_rows_start;
  int single_col;
  int dec_tile_col;
  int single_row;
  int dec_tile_row;
  TileBufferDec (*tile_buffers) [64];
  int n_tiles;
  int tile_rows;
  int tile_cols;
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  TileBufferDec (*in_stack_000001b8) [64];
  uint8_t *in_stack_000001c0;
  uint8_t *in_stack_000001c8;
  AV1Decoder *in_stack_000001d0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int tile_cols_00;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int start_tile_00;
  int tile_rows_start_00;
  AV1Decoder *in_stack_ffffffffffffff40;
  uint8_t *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar5;
  TileInfo *in_stack_ffffffffffffff58;
  int local_a0;
  int local_9c;
  int local_90;
  int local_8c;
  uint8_t *local_88;
  int local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int iVar6;
  uint8_t *local_8;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3b60);
  piVar3 = (int *)(in_RDI + 0x9c00);
  iVar5 = *piVar3;
  iVar6 = *(int *)(in_RDI + 0x9c04);
  iVar1 = iVar5 * iVar6;
  tile_rows_start_00 = iVar6;
  if (*(int *)(in_RDI + 0x58da0) < iVar6) {
    tile_rows_start_00 = *(int *)(in_RDI + 0x58da0);
  }
  start_tile_00 = iVar5;
  if (*(int *)(in_RDI + 0x58da4) < iVar5) {
    start_tile_00 = *(int *)(in_RDI + 0x58da4);
  }
  local_78 = 0;
  local_88 = (uint8_t *)0x0;
  local_8c = 0;
  local_70 = iVar5;
  if (*(int *)(in_RDI + 0x9e44) == 0) {
    local_64 = 0;
    local_6c = 0;
    local_68 = iVar6;
  }
  else {
    if (*(int *)(in_RDI + 0x58da0) < 0) {
      in_stack_ffffffffffffff34 = 0;
      in_stack_ffffffffffffff30 = iVar6;
    }
    else {
      in_stack_ffffffffffffff30 = tile_rows_start_00 + 1;
      in_stack_ffffffffffffff34 = tile_rows_start_00;
    }
    local_68 = in_stack_ffffffffffffff30;
    local_64 = in_stack_ffffffffffffff34;
    if (*(int *)(in_RDI + 0x58da4) < 0) {
      in_stack_ffffffffffffff2c = 0;
      in_stack_ffffffffffffff28 = iVar5;
      local_6c = in_stack_ffffffffffffff2c;
    }
    else {
      in_stack_ffffffffffffff28 = start_tile_00 + 1;
      in_stack_ffffffffffffff2c = start_tile_00;
      local_70 = start_tile_00 + 1;
      local_6c = start_tile_00;
    }
  }
  tile_cols_00 = *(int *)(in_RDI + 0x58d88);
  local_8 = in_RSI;
  if ((((local_64 < local_68) && (local_6c < local_70)) && (local_64 * iVar5 + local_6c <= in_R8D))
     && (in_ECX <= (local_68 + -1) * iVar5 + local_70 + -1)) {
    decode_mt_init((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (piVar3[0x91] == 0) {
      get_tile_buffers((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48,(uint8_t *)in_stack_ffffffffffffff40,
                       (TileBufferDec (*) [64])CONCAT44(tile_rows_start_00,start_tile_00),
                       in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
    }
    else {
      local_88 = get_ls_tile_buffers(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,
                                     in_stack_000001b8);
    }
    if ((*(long *)(in_RDI + 0x48d20) == 0) || (iVar1 != *(int *)(in_RDI + 0x48d28))) {
      if (*(long *)(in_RDI + 0x48d20) != 0) {
        for (local_90 = 0; local_90 < *(int *)(in_RDI + 0x48d28); local_90 = local_90 + 1) {
          av1_dec_row_mt_dealloc
                    ((AV1DecRowMTSync *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        }
      }
      decoder_alloc_tile_data
                ((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c);
    }
    if (*(long *)(in_RDI + 0x2a10) == 0) {
      pvVar4 = aom_memalign(CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      *(void **)(in_RDI + 0x2a10) = pvVar4;
      if (*(long *)(in_RDI + 0x2a10) == 0) {
        aom_internal_error(cm_00->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->dcb.xd.seg_mask");
      }
    }
    for (local_9c = 0; iVar2 = (int)in_stack_ffffffffffffff58, local_9c < iVar6;
        local_9c = local_9c + 1) {
      for (local_a0 = 0; local_a0 < iVar5; local_a0 = local_a0 + 1) {
        in_stack_ffffffffffffff58 =
             (TileInfo *)
             (*(long *)(in_RDI + 0x48d20) + (long)(local_9c * *piVar3) * 0x53a0 +
             (long)local_a0 * 0x53a0);
        av1_tile_init((TileInfo *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (AV1_COMMON *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0,
                      0x4bc9c5);
        in_stack_ffffffffffffff24 = local_8c;
        iVar2 = av1_get_sb_rows_in_tile(cm_00,in_stack_ffffffffffffff58);
        if (in_stack_ffffffffffffff24 <= iVar2) {
          local_8c = av1_get_sb_rows_in_tile(cm_00,in_stack_ffffffffffffff58);
        }
        in_stack_ffffffffffffff20 = local_8c;
        iVar2 = get_max_row_mt_workers_per_tile
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           (TileInfo *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                          );
        local_78 = iVar2 + local_78;
      }
    }
    if (local_78 < tile_cols_00) {
      tile_cols_00 = local_78;
    }
    if (*(int *)(in_RDI + 0x5f6dc) != local_8c) {
      for (iVar5 = 0; iVar2 = (int)in_stack_ffffffffffffff58, iVar5 < iVar1; iVar5 = iVar5 + 1) {
        av1_dec_row_mt_dealloc
                  ((AV1DecRowMTSync *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
        ;
        dec_row_mt_alloc((AV1DecRowMTSync *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (AV1_COMMON *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                         ,0);
      }
      *(int *)(in_RDI + 0x5f6dc) = local_8c;
    }
    tile_mt_queue((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  tile_cols_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                  in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff30,
                  start_tile_00,(int)in_stack_ffffffffffffff40);
    dec_alloc_cb_buf((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff04,in_ECX));
    row_mt_frame_init(in_stack_ffffffffffffff40,tile_rows_start_00,start_tile_00,
                      in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                      in_stack_ffffffffffffff50,iVar2);
    reset_dec_workers((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (AVxWorkerHook)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      in_stack_ffffffffffffff24);
    launch_dec_workers((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (uint8_t *)CONCAT44(tile_cols_00,in_stack_ffffffffffffff18),
                       in_stack_ffffffffffffff14);
    sync_dec_workers((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff0c);
    if (*(int *)(in_RDI + 0x3ad0) != 0) {
      aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                         "Failed to decode tile data");
    }
    if (piVar3[0x91] == 0) {
      local_8 = aom_reader_find_end((aom_reader *)
                                    (*(long *)(in_RDI + 0x48d20) + (long)in_R8D * 0x53a0 + 0x18));
    }
    else if (iVar1 == 1) {
      local_8 = aom_reader_find_end((aom_reader *)(*(long *)(in_RDI + 0x48d20) + 0x18));
    }
    else {
      local_8 = local_88;
    }
  }
  return local_8;
}

Assistant:

static const uint8_t *decode_tiles_row_mt(AV1Decoder *pbi, const uint8_t *data,
                                          const uint8_t *data_end,
                                          int start_tile, int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  CommonTileParams *const tiles = &cm->tiles;
  const int tile_cols = tiles->cols;
  const int tile_rows = tiles->rows;
  const int n_tiles = tile_cols * tile_rows;
  TileBufferDec(*const tile_buffers)[MAX_TILE_COLS] = pbi->tile_buffers;
  const int dec_tile_row = AOMMIN(pbi->dec_tile_row, tile_rows);
  const int single_row = pbi->dec_tile_row >= 0;
  const int dec_tile_col = AOMMIN(pbi->dec_tile_col, tile_cols);
  const int single_col = pbi->dec_tile_col >= 0;
  int tile_rows_start;
  int tile_rows_end;
  int tile_cols_start;
  int tile_cols_end;
  int tile_count_tg;
  int num_workers = 0;
  int max_threads;
  const uint8_t *raw_data_end = NULL;
  int max_sb_rows = 0;

  if (tiles->large_scale) {
    tile_rows_start = single_row ? dec_tile_row : 0;
    tile_rows_end = single_row ? dec_tile_row + 1 : tile_rows;
    tile_cols_start = single_col ? dec_tile_col : 0;
    tile_cols_end = single_col ? tile_cols_start + 1 : tile_cols;
  } else {
    tile_rows_start = 0;
    tile_rows_end = tile_rows;
    tile_cols_start = 0;
    tile_cols_end = tile_cols;
  }
  tile_count_tg = end_tile - start_tile + 1;
  max_threads = pbi->max_threads;

  // No tiles to decode.
  if (tile_rows_end <= tile_rows_start || tile_cols_end <= tile_cols_start ||
      // First tile is larger than end_tile.
      tile_rows_start * tile_cols + tile_cols_start > end_tile ||
      // Last tile is smaller than start_tile.
      (tile_rows_end - 1) * tile_cols + tile_cols_end - 1 < start_tile)
    return data;

  assert(tile_rows <= MAX_TILE_ROWS);
  assert(tile_cols <= MAX_TILE_COLS);
  assert(tile_count_tg > 0);
  assert(max_threads > 0);
  assert(start_tile <= end_tile);
  assert(start_tile >= 0 && end_tile < n_tiles);

  (void)tile_count_tg;

  decode_mt_init(pbi);

  // get tile size in tile group
#if EXT_TILE_DEBUG
  if (tiles->large_scale) assert(pbi->ext_tile_debug == 1);
  if (tiles->large_scale)
    raw_data_end = get_ls_tile_buffers(pbi, data, data_end, tile_buffers);
  else
#endif  // EXT_TILE_DEBUG
    get_tile_buffers(pbi, data, data_end, tile_buffers, start_tile, end_tile);

  if (pbi->tile_data == NULL || n_tiles != pbi->allocated_tiles) {
    if (pbi->tile_data != NULL) {
      for (int i = 0; i < pbi->allocated_tiles; i++) {
        TileDataDec *const tile_data = pbi->tile_data + i;
        av1_dec_row_mt_dealloc(&tile_data->dec_row_mt_sync);
      }
    }
    decoder_alloc_tile_data(pbi, n_tiles);
  }
  if (pbi->dcb.xd.seg_mask == NULL)
    CHECK_MEM_ERROR(cm, pbi->dcb.xd.seg_mask,
                    (uint8_t *)aom_memalign(
                        16, 2 * MAX_SB_SQUARE * sizeof(*pbi->dcb.xd.seg_mask)));

  for (int row = 0; row < tile_rows; row++) {
    for (int col = 0; col < tile_cols; col++) {
      TileDataDec *tile_data = pbi->tile_data + row * tiles->cols + col;
      av1_tile_init(&tile_data->tile_info, cm, row, col);

      max_sb_rows = AOMMAX(max_sb_rows,
                           av1_get_sb_rows_in_tile(cm, &tile_data->tile_info));
      num_workers += get_max_row_mt_workers_per_tile(cm, &tile_data->tile_info);
    }
  }
  num_workers = AOMMIN(num_workers, max_threads);

  if (pbi->allocated_row_mt_sync_rows != max_sb_rows) {
    for (int i = 0; i < n_tiles; ++i) {
      TileDataDec *const tile_data = pbi->tile_data + i;
      av1_dec_row_mt_dealloc(&tile_data->dec_row_mt_sync);
      dec_row_mt_alloc(&tile_data->dec_row_mt_sync, cm, max_sb_rows);
    }
    pbi->allocated_row_mt_sync_rows = max_sb_rows;
  }

  tile_mt_queue(pbi, tile_cols, tile_rows, tile_rows_start, tile_rows_end,
                tile_cols_start, tile_cols_end, start_tile, end_tile);

  dec_alloc_cb_buf(pbi);

  row_mt_frame_init(pbi, tile_rows_start, tile_rows_end, tile_cols_start,
                    tile_cols_end, start_tile, end_tile, max_sb_rows);

  reset_dec_workers(pbi, row_mt_worker_hook, num_workers);
  launch_dec_workers(pbi, data_end, num_workers);
  sync_dec_workers(pbi, num_workers);

  if (pbi->dcb.corrupted)
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "Failed to decode tile data");

  if (tiles->large_scale) {
    if (n_tiles == 1) {
      // Find the end of the single tile buffer
      return aom_reader_find_end(&pbi->tile_data->bit_reader);
    }
    // Return the end of the last tile buffer
    return raw_data_end;
  }
  TileDataDec *const tile_data = pbi->tile_data + end_tile;

  return aom_reader_find_end(&tile_data->bit_reader);
}